

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_float(MatroskaDemuxer *this,uint32_t *id,double *num)

{
  ulong uVar1;
  uint v;
  uint64_t v_00;
  ostream *poVar2;
  VodCoreException *this_00;
  float fVar3;
  double dVar4;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  offset_t pos;
  int64_t size;
  double *pdStack_28;
  int res;
  double *num_local;
  uint32_t *id_local;
  MatroskaDemuxer *this_local;
  
  pdStack_28 = num;
  num_local = (double *)id;
  id_local = (uint32_t *)this;
  size._4_4_ = ebml_read_element_id(this,id,(int *)0x0);
  if ((-1 < size._4_4_) &&
     (size._4_4_ = ebml_read_element_length(this,(int64_t *)&pos), -1 < size._4_4_)) {
    if (pos == 4) {
      v = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
      fVar3 = av_int2flt(v);
      *pdStack_28 = (double)fVar3;
    }
    else {
      if (pos != 8) {
        uVar1 = (this->super_IOContextDemuxer).m_processedBytes;
        std::__cxx11::ostringstream::ostringstream(local_1b8);
        poVar2 = std::operator<<((ostream *)local_1b8,"Invalid float element size ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pos);
        poVar2 = std::operator<<(poVar2," at position ");
        std::ostream::operator<<(poVar2,uVar1);
        this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(this_00,900,&local_1e8);
        __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      v_00 = IOContextDemuxer::get_be64(&this->super_IOContextDemuxer);
      dVar4 = av_int2dbl(v_00);
      *pdStack_28 = dVar4;
    }
    return 0;
  }
  return size._4_4_;
}

Assistant:

int MatroskaDemuxer::ebml_read_float(uint32_t *id, double *num)
{
    int res;
    int64_t size;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&size)) < 0)
        return res;

    if (size == 4)
    {
        *num = av_int2flt(get_be32());
    }
    else if (size == 8)
    {
        *num = av_int2dbl(get_be64());
    }
    else
    {
        const offset_t pos = m_processedBytes;
        THROW(ERR_MATROSKA_PARSE, "Invalid float element size " << size << " at position " << pos)
    }
    return 0;
}